

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx512::
     BVHNIntersectorKHybrid<4,_4,_16777232,_false,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::TriangleMvMBIntersectorKMoeller<4,_4,_true>_>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  RayK<4> *pRVar1;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar2;
  BVH *bvh;
  size_t sVar3;
  Geometry *pGVar4;
  RTCFilterFunctionN p_Var5;
  bool bVar6;
  bool bVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  byte bVar25;
  int iVar26;
  AABBNodeMB4D *node1;
  ulong uVar27;
  byte bVar28;
  byte bVar29;
  NodeRef root;
  long lVar30;
  byte bVar31;
  NodeRef *pNVar32;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar33;
  uint uVar34;
  undefined4 uVar35;
  bool bVar36;
  ulong uVar37;
  byte bVar38;
  ulong uVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  vint4 ai_2;
  vint4 ai;
  undefined1 auVar59 [16];
  undefined1 in_ZMM2 [64];
  vint4 ai_1;
  undefined1 auVar60 [16];
  vint4 ai_3;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  vint4 bi;
  undefined1 auVar63 [16];
  vint4 bi_1;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  vint4 bi_3;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  vint4 bi_2;
  undefined1 auVar70 [16];
  uint uVar71;
  uint uVar72;
  uint uVar73;
  uint uVar74;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [64];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [64];
  undefined1 auVar85 [64];
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  undefined1 auVar88 [64];
  undefined1 in_ZMM23 [64];
  undefined1 auVar89 [64];
  Precalculations pre;
  undefined1 local_1948 [16];
  ulong local_1930;
  int local_1928;
  int iStack_1924;
  int iStack_1920;
  int iStack_191c;
  RTCFilterFunctionNArguments args;
  undefined1 local_18e8 [16];
  undefined1 local_18d8 [16];
  undefined1 local_18c8 [16];
  undefined1 local_18b8 [16];
  undefined1 local_18a8 [16];
  undefined1 local_1898 [8];
  float fStack_1890;
  float fStack_188c;
  undefined1 local_1888 [8];
  float fStack_1880;
  float fStack_187c;
  TravRayK<4,_false> tray;
  undefined8 local_1768;
  undefined8 uStack_1760;
  undefined8 local_1758;
  undefined8 uStack_1750;
  undefined1 local_1748 [16];
  undefined1 local_1738 [16];
  float local_1728;
  float fStack_1724;
  float fStack_1720;
  float fStack_171c;
  undefined1 local_1718 [16];
  undefined1 local_1708 [16];
  uint local_16f8;
  uint uStack_16f4;
  uint uStack_16f0;
  uint uStack_16ec;
  uint uStack_16e8;
  uint uStack_16e4;
  uint uStack_16e0;
  uint uStack_16dc;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  bvh = (BVH *)This->ptr;
  if ((bvh->root).ptr != 8) {
    auVar40 = vpcmpeqd_avx(in_ZMM2._0_16_,in_ZMM2._0_16_);
    auVar45 = ZEXT816(0) << 0x40;
    uVar8 = vcmpps_avx512vl(*(undefined1 (*) [16])(ray + 0x80),auVar45,5);
    uVar39 = vpcmpeqd_avx512vl(auVar40,(undefined1  [16])valid_i->field_0);
    uVar39 = ((byte)uVar8 & 0xf) & uVar39;
    bVar38 = (byte)uVar39;
    if (bVar38 != 0) {
      tray.org.field_0._0_4_ = *(undefined4 *)ray;
      tray.org.field_0._4_4_ = *(undefined4 *)(ray + 4);
      tray.org.field_0._8_4_ = *(undefined4 *)(ray + 8);
      tray.org.field_0._12_4_ = *(undefined4 *)(ray + 0xc);
      tray.org.field_0._16_4_ = *(undefined4 *)(ray + 0x10);
      tray.org.field_0._20_4_ = *(undefined4 *)(ray + 0x14);
      tray.org.field_0._24_4_ = *(undefined4 *)(ray + 0x18);
      tray.org.field_0._28_4_ = *(undefined4 *)(ray + 0x1c);
      tray.org.field_0._32_4_ = *(undefined4 *)(ray + 0x20);
      tray.org.field_0._36_4_ = *(undefined4 *)(ray + 0x24);
      tray.org.field_0._40_4_ = *(undefined4 *)(ray + 0x28);
      tray.org.field_0._44_4_ = *(undefined4 *)(ray + 0x2c);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      auVar40 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar84 = ZEXT1664(auVar40);
      auVar41 = vandps_avx512vl((undefined1  [16])tray.dir.field_0.field_0.x.field_0,auVar40);
      auVar43._8_4_ = 0x219392ef;
      auVar43._0_8_ = 0x219392ef219392ef;
      auVar43._12_4_ = 0x219392ef;
      uVar27 = vcmpps_avx512vl(auVar41,auVar43,1);
      bVar36 = (bool)((byte)uVar27 & 1);
      auVar41._0_4_ = (uint)bVar36 * 0x219392ef | (uint)!bVar36 * tray.dir.field_0._0_4_;
      bVar36 = (bool)((byte)(uVar27 >> 1) & 1);
      auVar41._4_4_ = (uint)bVar36 * 0x219392ef | (uint)!bVar36 * tray.dir.field_0._4_4_;
      bVar36 = (bool)((byte)(uVar27 >> 2) & 1);
      auVar41._8_4_ = (uint)bVar36 * 0x219392ef | (uint)!bVar36 * tray.dir.field_0._8_4_;
      bVar36 = (bool)((byte)(uVar27 >> 3) & 1);
      auVar41._12_4_ = (uint)bVar36 * 0x219392ef | (uint)!bVar36 * tray.dir.field_0._12_4_;
      auVar42 = vandps_avx512vl((undefined1  [16])tray.dir.field_0.field_0.y.field_0,auVar40);
      uVar27 = vcmpps_avx512vl(auVar42,auVar43,1);
      bVar36 = (bool)((byte)uVar27 & 1);
      auVar42._0_4_ = (uint)bVar36 * 0x219392ef | (uint)!bVar36 * tray.dir.field_0._16_4_;
      bVar36 = (bool)((byte)(uVar27 >> 1) & 1);
      auVar42._4_4_ = (uint)bVar36 * 0x219392ef | (uint)!bVar36 * tray.dir.field_0._20_4_;
      bVar36 = (bool)((byte)(uVar27 >> 2) & 1);
      auVar42._8_4_ = (uint)bVar36 * 0x219392ef | (uint)!bVar36 * tray.dir.field_0._24_4_;
      bVar36 = (bool)((byte)(uVar27 >> 3) & 1);
      auVar42._12_4_ = (uint)bVar36 * 0x219392ef | (uint)!bVar36 * tray.dir.field_0._28_4_;
      auVar40 = vandps_avx512vl((undefined1  [16])tray.dir.field_0.field_0.z.field_0,auVar40);
      uVar27 = vcmpps_avx512vl(auVar40,auVar43,1);
      bVar36 = (bool)((byte)uVar27 & 1);
      auVar40._0_4_ = (uint)bVar36 * 0x219392ef | (uint)!bVar36 * tray.dir.field_0._32_4_;
      bVar36 = (bool)((byte)(uVar27 >> 1) & 1);
      auVar40._4_4_ = (uint)bVar36 * 0x219392ef | (uint)!bVar36 * tray.dir.field_0._36_4_;
      bVar36 = (bool)((byte)(uVar27 >> 2) & 1);
      auVar40._8_4_ = (uint)bVar36 * 0x219392ef | (uint)!bVar36 * tray.dir.field_0._40_4_;
      bVar36 = (bool)((byte)(uVar27 >> 3) & 1);
      auVar40._12_4_ = (uint)bVar36 * 0x219392ef | (uint)!bVar36 * tray.dir.field_0._44_4_;
      auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar85 = ZEXT1664(auVar43);
      auVar44 = vrcp14ps_avx512vl(auVar41);
      auVar41 = vfnmadd213ps_avx512vl(auVar41,auVar44,auVar43);
      tray.rdir.field_0.field_0.x.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar41,auVar44,auVar44)
      ;
      auVar41 = vrcp14ps_avx512vl(auVar42);
      auVar42 = vfnmadd213ps_avx512vl(auVar42,auVar41,auVar43);
      tray.rdir.field_0.field_0.y.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar42,auVar41,auVar41)
      ;
      auVar41 = vrcp14ps_avx512vl(auVar40);
      auVar40 = vfnmadd213ps_avx512vl(auVar40,auVar41,auVar43);
      tray.rdir.field_0.field_0.z.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar40,auVar41,auVar41)
      ;
      tray.org_rdir.field_0._0_4_ = (float)tray.org.field_0._0_4_ * tray.rdir.field_0._0_4_;
      tray.org_rdir.field_0._4_4_ = (float)tray.org.field_0._4_4_ * tray.rdir.field_0._4_4_;
      tray.org_rdir.field_0._8_4_ = (float)tray.org.field_0._8_4_ * tray.rdir.field_0._8_4_;
      tray.org_rdir.field_0._12_4_ = (float)tray.org.field_0._12_4_ * tray.rdir.field_0._12_4_;
      tray.org_rdir.field_0._16_4_ = (float)tray.org.field_0._16_4_ * tray.rdir.field_0._16_4_;
      tray.org_rdir.field_0._20_4_ = (float)tray.org.field_0._20_4_ * tray.rdir.field_0._20_4_;
      tray.org_rdir.field_0._24_4_ = (float)tray.org.field_0._24_4_ * tray.rdir.field_0._24_4_;
      tray.org_rdir.field_0._28_4_ = (float)tray.org.field_0._28_4_ * tray.rdir.field_0._28_4_;
      tray.org_rdir.field_0._32_4_ = (float)tray.org.field_0._32_4_ * tray.rdir.field_0._32_4_;
      tray.org_rdir.field_0._36_4_ = (float)tray.org.field_0._36_4_ * tray.rdir.field_0._36_4_;
      tray.org_rdir.field_0._40_4_ = (float)tray.org.field_0._40_4_ * tray.rdir.field_0._40_4_;
      tray.org_rdir.field_0._44_4_ = (float)tray.org.field_0._44_4_ * tray.rdir.field_0._44_4_;
      uVar27 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar45,1);
      auVar40 = vpbroadcastd_avx512vl(ZEXT416(0x10));
      tray.nearXYZ.field_0._0_4_ = (uint)((byte)uVar27 & 1) * auVar40._0_4_;
      tray.nearXYZ.field_0._4_4_ = (uint)((byte)(uVar27 >> 1) & 1) * auVar40._4_4_;
      tray.nearXYZ.field_0._8_4_ = (uint)((byte)(uVar27 >> 2) & 1) * auVar40._8_4_;
      tray.nearXYZ.field_0._12_4_ = (uint)((byte)(uVar27 >> 3) & 1) * auVar40._12_4_;
      uVar27 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar45,5);
      auVar40 = vpbroadcastd_avx512vl(ZEXT416(0x20));
      bVar36 = (bool)((byte)uVar27 & 1);
      tray.nearXYZ.field_0._16_4_ = (uint)bVar36 * auVar40._0_4_ | (uint)!bVar36 * 0x30;
      bVar36 = (bool)((byte)(uVar27 >> 1) & 1);
      tray.nearXYZ.field_0._20_4_ = (uint)bVar36 * auVar40._4_4_ | (uint)!bVar36 * 0x30;
      bVar36 = (bool)((byte)(uVar27 >> 2) & 1);
      tray.nearXYZ.field_0._24_4_ = (uint)bVar36 * auVar40._8_4_ | (uint)!bVar36 * 0x30;
      bVar36 = (bool)((byte)(uVar27 >> 3) & 1);
      tray.nearXYZ.field_0._28_4_ = (uint)bVar36 * auVar40._12_4_ | (uint)!bVar36 * 0x30;
      uVar27 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar45,5);
      auVar40 = vpbroadcastd_avx512vl(ZEXT416(0x40));
      bVar36 = (bool)((byte)uVar27 & 1);
      tray.nearXYZ.field_0._32_4_ = (uint)bVar36 * auVar40._0_4_ | (uint)!bVar36 * 0x50;
      bVar36 = (bool)((byte)(uVar27 >> 1) & 1);
      tray.nearXYZ.field_0._36_4_ = (uint)bVar36 * auVar40._4_4_ | (uint)!bVar36 * 0x50;
      bVar36 = (bool)((byte)(uVar27 >> 2) & 1);
      tray.nearXYZ.field_0._40_4_ = (uint)bVar36 * auVar40._8_4_ | (uint)!bVar36 * 0x50;
      bVar36 = (bool)((byte)(uVar27 >> 3) & 1);
      tray.nearXYZ.field_0._44_4_ = (uint)bVar36 * auVar40._12_4_ | (uint)!bVar36 * 0x50;
      stack_near[0].field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vbroadcastss_avx512vl(ZEXT416(0x7f800000))
      ;
      auVar87 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      auVar40 = vmaxps_avx512vl(*(undefined1 (*) [16])(ray + 0x30),auVar45);
      tray.tnear.field_0._0_4_ =
           (uint)(bVar38 & 1) * auVar40._0_4_ |
           (uint)!(bool)(bVar38 & 1) * stack_near[0].field_0._0_4_;
      bVar36 = (bool)((byte)(uVar39 >> 1) & 1);
      tray.tnear.field_0._4_4_ =
           (uint)bVar36 * auVar40._4_4_ | (uint)!bVar36 * stack_near[0].field_0._4_4_;
      bVar36 = (bool)((byte)(uVar39 >> 2) & 1);
      tray.tnear.field_0._8_4_ =
           (uint)bVar36 * auVar40._8_4_ | (uint)!bVar36 * stack_near[0].field_0._8_4_;
      bVar36 = SUB81(uVar39 >> 3,0);
      tray.tnear.field_0._12_4_ =
           (uint)bVar36 * auVar40._12_4_ | (uint)!bVar36 * stack_near[0].field_0._12_4_;
      auVar40 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar86 = ZEXT1664(auVar40);
      auVar45 = vmaxps_avx512vl(*(undefined1 (*) [16])(ray + 0x80),auVar45);
      tray.tfar.field_0.i[0] =
           (uint)(bVar38 & 1) * auVar45._0_4_ | (uint)!(bool)(bVar38 & 1) * auVar40._0_4_;
      bVar36 = (bool)((byte)(uVar39 >> 1) & 1);
      tray.tfar.field_0.i[1] = (uint)bVar36 * auVar45._4_4_ | (uint)!bVar36 * auVar40._4_4_;
      bVar36 = (bool)((byte)(uVar39 >> 2) & 1);
      tray.tfar.field_0.i[2] = (uint)bVar36 * auVar45._8_4_ | (uint)!bVar36 * auVar40._8_4_;
      bVar36 = SUB81(uVar39 >> 3,0);
      tray.tfar.field_0.i[3] = (uint)bVar36 * auVar45._12_4_ | (uint)!bVar36 * auVar40._12_4_;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar34 = 3;
      }
      else {
        uVar34 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      pRVar1 = ray + 0x80;
      bVar31 = (byte)((ushort)((short)uVar39 << 0xc) >> 0xc) ^ 0xf;
      pNVar32 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar33 = &stack_near[2].field_0;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      stack_node[1].ptr = (bvh->root).ptr;
      auVar40 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar88 = ZEXT1664(auVar40);
      auVar40 = vxorps_avx512vl(in_ZMM23._0_16_,in_ZMM23._0_16_);
      auVar89 = ZEXT1664(auVar40);
LAB_00736446:
      paVar33 = paVar33 + -1;
      root.ptr = pNVar32[-1].ptr;
      pNVar32 = pNVar32 + -1;
      if (root.ptr == 0xfffffffffffffff8) goto LAB_00736c99;
      aVar2 = *paVar33;
      uVar39 = vcmpps_avx512vl((undefined1  [16])aVar2,(undefined1  [16])tray.tfar.field_0,1);
      if ((char)uVar39 == '\0') {
LAB_00736ccf:
        iVar26 = 2;
      }
      else {
        uVar35 = (undefined4)uVar39;
        iVar26 = 0;
        if ((uint)POPCOUNT(uVar35) <= uVar34) {
          do {
            sVar3 = 0;
            for (uVar27 = uVar39; (uVar27 & 1) == 0; uVar27 = uVar27 >> 1 | 0x8000000000000000) {
              sVar3 = sVar3 + 1;
            }
            bVar36 = occluded1(This,bvh,root,sVar3,&pre,ray,&tray,context);
            bVar25 = (byte)(1 << ((uint)sVar3 & 0x1f));
            if (!bVar36) {
              bVar25 = 0;
            }
            bVar31 = bVar31 | bVar25;
            uVar39 = uVar39 - 1 & uVar39;
          } while (uVar39 != 0);
          if (bVar31 == 0xf) {
            iVar26 = 3;
          }
          else {
            auVar40 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
            tray.tfar.field_0.i[0] =
                 (uint)(bVar31 & 1) * auVar40._0_4_ |
                 (uint)!(bool)(bVar31 & 1) * tray.tfar.field_0.i[0];
            bVar36 = (bool)(bVar31 >> 1 & 1);
            tray.tfar.field_0.i[1] =
                 (uint)bVar36 * auVar40._4_4_ | (uint)!bVar36 * tray.tfar.field_0.i[1];
            bVar36 = (bool)(bVar31 >> 2 & 1);
            tray.tfar.field_0.i[2] =
                 (uint)bVar36 * auVar40._8_4_ | (uint)!bVar36 * tray.tfar.field_0.i[2];
            bVar36 = (bool)(bVar31 >> 3 & 1);
            tray.tfar.field_0.i[3] =
                 (uint)bVar36 * auVar40._12_4_ | (uint)!bVar36 * tray.tfar.field_0.i[3];
            iVar26 = 2;
          }
          auVar40 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          auVar84 = ZEXT1664(auVar40);
          auVar40 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar85 = ZEXT1664(auVar40);
          auVar40 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
          auVar86 = ZEXT1664(auVar40);
          auVar40 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
          auVar87 = ZEXT1664(auVar40);
          auVar40 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
          auVar88 = ZEXT1664(auVar40);
          auVar40 = vxorps_avx512vl(auVar89._0_16_,auVar89._0_16_);
          auVar89 = ZEXT1664(auVar40);
        }
        auVar81 = ZEXT1664((undefined1  [16])aVar2);
        if (uVar34 < (uint)POPCOUNT(uVar35)) {
          do {
            uVar71 = (uint)root.ptr;
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_00736c99;
              uVar8 = vcmpps_avx512vl(auVar81._0_16_,(undefined1  [16])tray.tfar.field_0,9);
              if ((char)uVar8 == '\0') goto LAB_00736ccf;
              bVar25 = bVar31 & 0xf;
              local_1930 = (ulong)(uVar71 & 0xf) - 8;
              if (local_1930 == 0) goto LAB_00736c90;
              bVar25 = bVar25 ^ 0xf;
              lVar30 = (root.ptr & 0xfffffffffffffff0) + 0x130;
              uVar39 = 0;
              goto LAB_007366dd;
            }
            uVar8 = vcmpps_avx512vl(auVar81._0_16_,(undefined1  [16])tray.tfar.field_0,9);
            uVar27 = root.ptr & 0xfffffffffffffff0;
            auVar81 = ZEXT1664(auVar87._0_16_);
            uVar39 = 0;
            root.ptr = 8;
            do {
              sVar3 = *(size_t *)(uVar27 + uVar39 * 8);
              if (sVar3 != 8) {
                uVar35 = *(undefined4 *)(uVar27 + 0x80 + uVar39 * 4);
                auVar59._4_4_ = uVar35;
                auVar59._0_4_ = uVar35;
                auVar59._8_4_ = uVar35;
                auVar59._12_4_ = uVar35;
                auVar40 = *(undefined1 (*) [16])(ray + 0x70);
                uVar35 = *(undefined4 *)(uVar27 + 0x20 + uVar39 * 4);
                auVar15._4_4_ = uVar35;
                auVar15._0_4_ = uVar35;
                auVar15._8_4_ = uVar35;
                auVar15._12_4_ = uVar35;
                auVar45 = vfmadd213ps_avx512vl(auVar59,auVar40,auVar15);
                uVar35 = *(undefined4 *)(uVar27 + 0xa0 + uVar39 * 4);
                auVar60._4_4_ = uVar35;
                auVar60._0_4_ = uVar35;
                auVar60._8_4_ = uVar35;
                auVar60._12_4_ = uVar35;
                uVar35 = *(undefined4 *)(uVar27 + 0x40 + uVar39 * 4);
                auVar16._4_4_ = uVar35;
                auVar16._0_4_ = uVar35;
                auVar16._8_4_ = uVar35;
                auVar16._12_4_ = uVar35;
                auVar41 = vfmadd213ps_avx512vl(auVar60,auVar40,auVar16);
                uVar35 = *(undefined4 *)(uVar27 + 0xc0 + uVar39 * 4);
                auVar61._4_4_ = uVar35;
                auVar61._0_4_ = uVar35;
                auVar61._8_4_ = uVar35;
                auVar61._12_4_ = uVar35;
                uVar35 = *(undefined4 *)(uVar27 + 0x60 + uVar39 * 4);
                auVar17._4_4_ = uVar35;
                auVar17._0_4_ = uVar35;
                auVar17._8_4_ = uVar35;
                auVar17._12_4_ = uVar35;
                auVar44 = vfmadd213ps_avx512vl(auVar61,auVar40,auVar17);
                uVar35 = *(undefined4 *)(uVar27 + 0x90 + uVar39 * 4);
                auVar63._4_4_ = uVar35;
                auVar63._0_4_ = uVar35;
                auVar63._8_4_ = uVar35;
                auVar63._12_4_ = uVar35;
                uVar35 = *(undefined4 *)(uVar27 + 0x30 + uVar39 * 4);
                auVar18._4_4_ = uVar35;
                auVar18._0_4_ = uVar35;
                auVar18._8_4_ = uVar35;
                auVar18._12_4_ = uVar35;
                auVar46 = vfmadd213ps_avx512vl(auVar63,auVar40,auVar18);
                uVar35 = *(undefined4 *)(uVar27 + 0xb0 + uVar39 * 4);
                auVar64._4_4_ = uVar35;
                auVar64._0_4_ = uVar35;
                auVar64._8_4_ = uVar35;
                auVar64._12_4_ = uVar35;
                uVar35 = *(undefined4 *)(uVar27 + 0x50 + uVar39 * 4);
                auVar19._4_4_ = uVar35;
                auVar19._0_4_ = uVar35;
                auVar19._8_4_ = uVar35;
                auVar19._12_4_ = uVar35;
                auVar47 = vfmadd213ps_avx512vl(auVar64,auVar40,auVar19);
                uVar35 = *(undefined4 *)(uVar27 + 0xd0 + uVar39 * 4);
                auVar66._4_4_ = uVar35;
                auVar66._0_4_ = uVar35;
                auVar66._8_4_ = uVar35;
                auVar66._12_4_ = uVar35;
                uVar35 = *(undefined4 *)(uVar27 + 0x70 + uVar39 * 4);
                auVar20._4_4_ = uVar35;
                auVar20._0_4_ = uVar35;
                auVar20._8_4_ = uVar35;
                auVar20._12_4_ = uVar35;
                auVar48 = vfmadd213ps_avx512vl(auVar66,auVar40,auVar20);
                auVar23._4_4_ = tray.org_rdir.field_0._4_4_;
                auVar23._0_4_ = tray.org_rdir.field_0._0_4_;
                auVar23._8_4_ = tray.org_rdir.field_0._8_4_;
                auVar23._12_4_ = tray.org_rdir.field_0._12_4_;
                auVar24._4_4_ = tray.org_rdir.field_0._20_4_;
                auVar24._0_4_ = tray.org_rdir.field_0._16_4_;
                auVar24._8_4_ = tray.org_rdir.field_0._24_4_;
                auVar24._12_4_ = tray.org_rdir.field_0._28_4_;
                auVar42 = vfmsub213ps_fma(auVar45,(undefined1  [16])
                                                  tray.rdir.field_0.field_0.x.field_0,auVar23);
                auVar43 = vfmsub213ps_fma(auVar41,(undefined1  [16])
                                                  tray.rdir.field_0.field_0.y.field_0,auVar24);
                auVar44 = vfmsub213ps_fma(auVar44,(undefined1  [16])
                                                  tray.rdir.field_0.field_0.z.field_0,
                                          (undefined1  [16])tray.org_rdir.field_0.field_0.z.field_0)
                ;
                auVar46 = vfmsub213ps_fma(auVar46,(undefined1  [16])
                                                  tray.rdir.field_0.field_0.x.field_0,auVar23);
                auVar47 = vfmsub213ps_fma(auVar47,(undefined1  [16])
                                                  tray.rdir.field_0.field_0.y.field_0,auVar24);
                auVar48 = vfmsub213ps_fma(auVar48,(undefined1  [16])
                                                  tray.rdir.field_0.field_0.z.field_0,
                                          (undefined1  [16])tray.org_rdir.field_0.field_0.z.field_0)
                ;
                auVar45 = vpminsd_avx(auVar42,auVar46);
                auVar41 = vpminsd_avx(auVar43,auVar47);
                auVar45 = vpmaxsd_avx(auVar45,auVar41);
                auVar41 = vpminsd_avx(auVar44,auVar48);
                auVar45 = vpmaxsd_avx(auVar45,auVar41);
                auVar41 = vpmaxsd_avx(auVar42,auVar46);
                auVar42 = vpmaxsd_avx(auVar43,auVar47);
                auVar42 = vpminsd_avx(auVar41,auVar42);
                auVar41 = vpmaxsd_avx(auVar44,auVar48);
                auVar42 = vpminsd_avx(auVar42,auVar41);
                auVar41 = vpmaxsd_avx(auVar45,(undefined1  [16])tray.tnear.field_0);
                auVar42 = vpminsd_avx(auVar42,(undefined1  [16])tray.tfar.field_0);
                uVar9 = vcmpps_avx512vl(auVar41,auVar42,2);
                bVar25 = (byte)uVar9;
                if ((uVar71 & 7) == 6) {
                  uVar35 = *(undefined4 *)(uVar27 + 0xf0 + uVar39 * 4);
                  auVar21._4_4_ = uVar35;
                  auVar21._0_4_ = uVar35;
                  auVar21._8_4_ = uVar35;
                  auVar21._12_4_ = uVar35;
                  uVar9 = vcmpps_avx512vl(auVar40,auVar21,1);
                  uVar35 = *(undefined4 *)(uVar27 + 0xe0 + uVar39 * 4);
                  auVar22._4_4_ = uVar35;
                  auVar22._0_4_ = uVar35;
                  auVar22._8_4_ = uVar35;
                  auVar22._12_4_ = uVar35;
                  uVar10 = vcmpps_avx512vl(auVar40,auVar22,0xd);
                  bVar25 = (byte)uVar9 & (byte)uVar10 & bVar25;
                }
                bVar25 = bVar25 & (byte)uVar8;
                if (bVar25 != 0) {
                  auVar45 = vblendmps_avx512vl(auVar87._0_16_,auVar45);
                  bVar36 = (bool)(bVar25 >> 1 & 1);
                  bVar6 = (bool)(bVar25 >> 2 & 1);
                  bVar7 = (bool)(bVar25 >> 3 & 1);
                  if (root.ptr != 8) {
                    pNVar32->ptr = root.ptr;
                    pNVar32 = pNVar32 + 1;
                    *paVar33 = auVar81._0_16_;
                    paVar33 = paVar33 + 1;
                  }
                  auVar81 = ZEXT1664(CONCAT412((uint)bVar7 * auVar45._12_4_ |
                                               (uint)!bVar7 * auVar40._12_4_,
                                               CONCAT48((uint)bVar6 * auVar45._8_4_ |
                                                        (uint)!bVar6 * auVar40._8_4_,
                                                        CONCAT44((uint)bVar36 * auVar45._4_4_ |
                                                                 (uint)!bVar36 * auVar40._4_4_,
                                                                 (uint)(bVar25 & 1) * auVar45._0_4_
                                                                 | (uint)!(bool)(bVar25 & 1) *
                                                                   auVar40._0_4_))));
                  root.ptr = sVar3;
                }
              }
            } while ((sVar3 != 8) && (bVar36 = uVar39 < 3, uVar39 = uVar39 + 1, bVar36));
            iVar26 = 0;
            if (root.ptr == 8) {
LAB_00736691:
              bVar36 = false;
              iVar26 = 4;
            }
            else {
              uVar8 = vcmpps_avx512vl((undefined1  [16])auVar81._0_16_,
                                      (undefined1  [16])tray.tfar.field_0,9);
              bVar36 = true;
              if ((uint)POPCOUNT((int)uVar8) <= uVar34) {
                pNVar32->ptr = root.ptr;
                pNVar32 = pNVar32 + 1;
                *paVar33 = auVar81._0_16_;
                paVar33 = paVar33 + 1;
                goto LAB_00736691;
              }
            }
          } while (bVar36);
        }
      }
      goto LAB_00736cc1;
    }
  }
  return;
  while( true ) {
    uVar39 = uVar39 + 1;
    lVar30 = lVar30 + 0x140;
    if (local_1930 <= uVar39) break;
LAB_007366dd:
    uVar27 = 0;
    bVar29 = bVar25;
    while (uVar37 = (ulong)*(uint *)(lVar30 + -0x10 + uVar27 * 4), uVar37 != 0xffffffff) {
      auVar40 = *(undefined1 (*) [16])(ray + 0x40);
      auVar45 = *(undefined1 (*) [16])(ray + 0x50);
      auVar41 = *(undefined1 (*) [16])(ray + 0x60);
      auVar42 = *(undefined1 (*) [16])(ray + 0x70);
      uVar35 = *(undefined4 *)(lVar30 + -0xa0 + uVar27 * 4);
      auVar50._4_4_ = uVar35;
      auVar50._0_4_ = uVar35;
      auVar50._8_4_ = uVar35;
      auVar50._12_4_ = uVar35;
      uVar35 = *(undefined4 *)(lVar30 + -0x90 + uVar27 * 4);
      auVar55._4_4_ = uVar35;
      auVar55._0_4_ = uVar35;
      auVar55._8_4_ = uVar35;
      auVar55._12_4_ = uVar35;
      uVar35 = *(undefined4 *)(lVar30 + -0x80 + uVar27 * 4);
      auVar67._4_4_ = uVar35;
      auVar67._0_4_ = uVar35;
      auVar67._8_4_ = uVar35;
      auVar67._12_4_ = uVar35;
      uVar35 = *(undefined4 *)(lVar30 + -0x130 + uVar27 * 4);
      auVar44._4_4_ = uVar35;
      auVar44._0_4_ = uVar35;
      auVar44._8_4_ = uVar35;
      auVar44._12_4_ = uVar35;
      auVar49 = vfmadd213ps_avx512vl(auVar50,auVar42,auVar44);
      uVar35 = *(undefined4 *)(lVar30 + -0x120 + uVar27 * 4);
      auVar46._4_4_ = uVar35;
      auVar46._0_4_ = uVar35;
      auVar46._8_4_ = uVar35;
      auVar46._12_4_ = uVar35;
      auVar50 = vfmadd213ps_avx512vl(auVar55,auVar42,auVar46);
      uVar35 = *(undefined4 *)(lVar30 + -0x110 + uVar27 * 4);
      auVar47._4_4_ = uVar35;
      auVar47._0_4_ = uVar35;
      auVar47._8_4_ = uVar35;
      auVar47._12_4_ = uVar35;
      auVar51 = vfmadd213ps_avx512vl(auVar67,auVar42,auVar47);
      uVar35 = *(undefined4 *)(lVar30 + -0x70 + uVar27 * 4);
      auVar53._4_4_ = uVar35;
      auVar53._0_4_ = uVar35;
      auVar53._8_4_ = uVar35;
      auVar53._12_4_ = uVar35;
      uVar35 = *(undefined4 *)(lVar30 + -0x60 + uVar27 * 4);
      auVar54._4_4_ = uVar35;
      auVar54._0_4_ = uVar35;
      auVar54._8_4_ = uVar35;
      auVar54._12_4_ = uVar35;
      uVar35 = *(undefined4 *)(lVar30 + -0x50 + uVar27 * 4);
      auVar75._4_4_ = uVar35;
      auVar75._0_4_ = uVar35;
      auVar75._8_4_ = uVar35;
      auVar75._12_4_ = uVar35;
      uVar35 = *(undefined4 *)(lVar30 + -0x100 + uVar27 * 4);
      auVar48._4_4_ = uVar35;
      auVar48._0_4_ = uVar35;
      auVar48._8_4_ = uVar35;
      auVar48._12_4_ = uVar35;
      auVar43 = vfmadd213ps_avx512vl(auVar53,auVar42,auVar48);
      uVar35 = *(undefined4 *)(lVar30 + -0xf0 + uVar27 * 4);
      auVar52._4_4_ = uVar35;
      auVar52._0_4_ = uVar35;
      auVar52._8_4_ = uVar35;
      auVar52._12_4_ = uVar35;
      auVar44 = vfmadd213ps_avx512vl(auVar54,auVar42,auVar52);
      uVar35 = *(undefined4 *)(lVar30 + -0xe0 + uVar27 * 4);
      auVar11._4_4_ = uVar35;
      auVar11._0_4_ = uVar35;
      auVar11._8_4_ = uVar35;
      auVar11._12_4_ = uVar35;
      auVar46 = vfmadd213ps_avx512vl(auVar75,auVar42,auVar11);
      uVar35 = *(undefined4 *)(lVar30 + -0x40 + uVar27 * 4);
      auVar77._4_4_ = uVar35;
      auVar77._0_4_ = uVar35;
      auVar77._8_4_ = uVar35;
      auVar77._12_4_ = uVar35;
      uVar35 = *(undefined4 *)(lVar30 + -0x30 + uVar27 * 4);
      auVar79._4_4_ = uVar35;
      auVar79._0_4_ = uVar35;
      auVar79._8_4_ = uVar35;
      auVar79._12_4_ = uVar35;
      uVar35 = *(undefined4 *)(lVar30 + -0x20 + uVar27 * 4);
      auVar82._4_4_ = uVar35;
      auVar82._0_4_ = uVar35;
      auVar82._8_4_ = uVar35;
      auVar82._12_4_ = uVar35;
      uVar35 = *(undefined4 *)(lVar30 + -0xd0 + uVar27 * 4);
      auVar12._4_4_ = uVar35;
      auVar12._0_4_ = uVar35;
      auVar12._8_4_ = uVar35;
      auVar12._12_4_ = uVar35;
      auVar47 = vfmadd213ps_avx512vl(auVar77,auVar42,auVar12);
      uVar35 = *(undefined4 *)(lVar30 + -0xc0 + uVar27 * 4);
      auVar13._4_4_ = uVar35;
      auVar13._0_4_ = uVar35;
      auVar13._8_4_ = uVar35;
      auVar13._12_4_ = uVar35;
      auVar48 = vfmadd213ps_avx512vl(auVar79,auVar42,auVar13);
      uVar35 = *(undefined4 *)(lVar30 + -0xb0 + uVar27 * 4);
      auVar14._4_4_ = uVar35;
      auVar14._0_4_ = uVar35;
      auVar14._8_4_ = uVar35;
      auVar14._12_4_ = uVar35;
      auVar52 = vfmadd213ps_avx512vl(auVar82,auVar42,auVar14);
      auVar42 = vsubps_avx(auVar49,auVar43);
      auVar43 = vsubps_avx(auVar50,auVar44);
      auVar44 = vsubps_avx(auVar51,auVar46);
      auVar46 = vsubps_avx(auVar47,auVar49);
      auVar53 = vsubps_avx512vl(auVar48,auVar50);
      auVar54 = vsubps_avx512vl(auVar52,auVar51);
      auVar47 = vmulps_avx512vl(auVar43,auVar54);
      auVar55 = vfmsub231ps_avx512vl(auVar47,auVar53,auVar44);
      auVar56._0_4_ = auVar44._0_4_ * auVar46._0_4_;
      auVar56._4_4_ = auVar44._4_4_ * auVar46._4_4_;
      auVar56._8_4_ = auVar44._8_4_ * auVar46._8_4_;
      auVar56._12_4_ = auVar44._12_4_ * auVar46._12_4_;
      auVar56 = vfmsub231ps_avx512vl(auVar56,auVar54,auVar42);
      auVar47 = vmulps_avx512vl(auVar42,auVar53);
      auVar11 = vfmsub231ps_fma(auVar47,auVar46,auVar43);
      auVar47 = vsubps_avx(auVar49,*(undefined1 (*) [16])ray);
      auVar48 = vsubps_avx(auVar50,*(undefined1 (*) [16])(ray + 0x10));
      auVar52 = vsubps_avx(auVar51,*(undefined1 (*) [16])(ray + 0x20));
      auVar78._0_4_ = auVar45._0_4_ * auVar52._0_4_;
      auVar78._4_4_ = auVar45._4_4_ * auVar52._4_4_;
      auVar78._8_4_ = auVar45._8_4_ * auVar52._8_4_;
      auVar78._12_4_ = auVar45._12_4_ * auVar52._12_4_;
      auVar12 = vfmsub231ps_fma(auVar78,auVar48,auVar41);
      auVar80._0_4_ = auVar41._0_4_ * auVar47._0_4_;
      auVar80._4_4_ = auVar41._4_4_ * auVar47._4_4_;
      auVar80._8_4_ = auVar41._8_4_ * auVar47._8_4_;
      auVar80._12_4_ = auVar41._12_4_ * auVar47._12_4_;
      auVar13 = vfmsub231ps_fma(auVar80,auVar52,auVar40);
      auVar83._0_4_ = auVar40._0_4_ * auVar48._0_4_;
      auVar83._4_4_ = auVar40._4_4_ * auVar48._4_4_;
      auVar83._8_4_ = auVar40._8_4_ * auVar48._8_4_;
      auVar83._12_4_ = auVar40._12_4_ * auVar48._12_4_;
      auVar14 = vfmsub231ps_fma(auVar83,auVar47,auVar45);
      auVar51._0_4_ = auVar11._0_4_ * auVar41._0_4_;
      auVar51._4_4_ = auVar11._4_4_ * auVar41._4_4_;
      auVar51._8_4_ = auVar11._8_4_ * auVar41._8_4_;
      auVar51._12_4_ = auVar11._12_4_ * auVar41._12_4_;
      auVar45 = vfmadd231ps_fma(auVar51,auVar56,auVar45);
      auVar40 = vfmadd231ps_fma(auVar45,auVar55,auVar40);
      auVar41 = vandps_avx512vl(auVar40,auVar88._0_16_);
      auVar45 = vmulps_avx512vl(auVar54,auVar14);
      auVar45 = vfmadd231ps_avx512vl(auVar45,auVar13,auVar53);
      auVar45 = vfmadd231ps_fma(auVar45,auVar12,auVar46);
      uVar71 = auVar41._0_4_;
      auVar49._0_4_ = uVar71 ^ auVar45._0_4_;
      uVar72 = auVar41._4_4_;
      auVar49._4_4_ = uVar72 ^ auVar45._4_4_;
      uVar73 = auVar41._8_4_;
      auVar49._8_4_ = uVar73 ^ auVar45._8_4_;
      uVar74 = auVar41._12_4_;
      auVar49._12_4_ = uVar74 ^ auVar45._12_4_;
      auVar45 = auVar89._0_16_;
      uVar8 = vcmpps_avx512vl(auVar49,auVar45,5);
      bVar28 = (byte)uVar8 & bVar29;
      if (bVar28 == 0) {
LAB_0073684e:
        bVar28 = 0;
      }
      else {
        auVar76._0_4_ = auVar44._0_4_ * auVar14._0_4_;
        auVar76._4_4_ = auVar44._4_4_ * auVar14._4_4_;
        auVar76._8_4_ = auVar44._8_4_ * auVar14._8_4_;
        auVar76._12_4_ = auVar44._12_4_ * auVar14._12_4_;
        auVar41 = vfmadd213ps_fma(auVar13,auVar43,auVar76);
        auVar41 = vfmadd213ps_fma(auVar12,auVar42,auVar41);
        auVar70._0_4_ = uVar71 ^ auVar41._0_4_;
        auVar70._4_4_ = uVar72 ^ auVar41._4_4_;
        auVar70._8_4_ = uVar73 ^ auVar41._8_4_;
        auVar70._12_4_ = uVar74 ^ auVar41._12_4_;
        uVar8 = vcmpps_avx512vl(auVar70,auVar45,5);
        bVar28 = bVar28 & (byte)uVar8;
        if (bVar28 == 0) goto LAB_0073684e;
        auVar42 = vandps_avx512vl(auVar40,auVar84._0_16_);
        auVar41 = vsubps_avx(auVar42,auVar49);
        uVar8 = vcmpps_avx512vl(auVar41,auVar70,5);
        bVar28 = bVar28 & (byte)uVar8;
        if (bVar28 == 0) {
LAB_00736ba1:
          bVar28 = 0;
        }
        else {
          auVar68._0_4_ = auVar52._0_4_ * auVar11._0_4_;
          auVar68._4_4_ = auVar52._4_4_ * auVar11._4_4_;
          auVar68._8_4_ = auVar52._8_4_ * auVar11._8_4_;
          auVar68._12_4_ = auVar52._12_4_ * auVar11._12_4_;
          auVar41 = vfmadd213ps_fma(auVar48,auVar56,auVar68);
          auVar41 = vfmadd213ps_fma(auVar47,auVar55,auVar41);
          auVar65._0_4_ = auVar42._0_4_ * *(float *)(ray + 0x30);
          auVar65._4_4_ = auVar42._4_4_ * *(float *)(ray + 0x34);
          auVar65._8_4_ = auVar42._8_4_ * *(float *)(ray + 0x38);
          auVar65._12_4_ = auVar42._12_4_ * *(float *)(ray + 0x3c);
          auVar62._0_4_ = uVar71 ^ auVar41._0_4_;
          auVar62._4_4_ = uVar72 ^ auVar41._4_4_;
          auVar62._8_4_ = uVar73 ^ auVar41._8_4_;
          auVar62._12_4_ = uVar74 ^ auVar41._12_4_;
          auVar69._0_4_ = auVar42._0_4_ * *(float *)(ray + 0x80);
          auVar69._4_4_ = auVar42._4_4_ * *(float *)(ray + 0x84);
          auVar69._8_4_ = auVar42._8_4_ * *(float *)(ray + 0x88);
          auVar69._12_4_ = auVar42._12_4_ * *(float *)(ray + 0x8c);
          uVar8 = vcmpps_avx512vl(auVar62,auVar69,2);
          uVar9 = vcmpps_avx512vl(auVar65,auVar62,1);
          bVar28 = bVar28 & (byte)uVar8 & (byte)uVar9;
          if (bVar28 == 0) goto LAB_00736ba1;
          uVar8 = vcmpps_avx512vl(auVar40,ZEXT816(0) << 0x20,4);
          bVar28 = bVar28 & (byte)uVar8;
          if (bVar28 != 0) {
            local_18e8 = auVar11;
            local_18d8 = auVar56;
            local_18c8 = auVar55;
            local_18b8 = auVar42;
            local_18a8 = auVar62;
            _local_1898 = auVar70;
            _local_1888 = auVar49;
          }
        }
        auVar84 = ZEXT1664(auVar84._0_16_);
        auVar40 = vxorps_avx512vl(auVar45,auVar45);
        auVar89 = ZEXT1664(auVar40);
      }
      auVar40 = auVar89._0_16_;
      pGVar4 = (context->scene->geometries).items[uVar37].ptr;
      uVar71 = pGVar4->mask;
      auVar45._4_4_ = uVar71;
      auVar45._0_4_ = uVar71;
      auVar45._8_4_ = uVar71;
      auVar45._12_4_ = uVar71;
      uVar8 = vptestmd_avx512vl(auVar45,*(undefined1 (*) [16])(ray + 0x90));
      bVar28 = (byte)uVar8 & 0xf & bVar28;
      uVar37 = (ulong)bVar28;
      if (bVar28 != 0) {
        if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
           (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
          auVar45 = vrcp14ps_avx512vl(local_18b8);
          auVar41 = vfnmadd213ps_avx512vl(auVar45,local_18b8,auVar85._0_16_);
          auVar45 = vfmadd132ps_fma(auVar41,auVar45,auVar45);
          local_1738._0_4_ = auVar45._0_4_ * (float)local_1888._0_4_;
          local_1738._4_4_ = auVar45._4_4_ * (float)local_1888._4_4_;
          local_1738._8_4_ = auVar45._8_4_ * fStack_1880;
          local_1738._12_4_ = auVar45._12_4_ * fStack_187c;
          local_1728 = auVar45._0_4_ * (float)local_1898._0_4_;
          fStack_1724 = auVar45._4_4_ * (float)local_1898._4_4_;
          fStack_1720 = auVar45._8_4_ * fStack_1890;
          fStack_171c = auVar45._12_4_ * fStack_188c;
          local_1708 = vpbroadcastd_avx512vl();
          local_1718 = vpbroadcastd_avx512vl();
          local_1768 = local_18c8._0_8_;
          uStack_1760 = local_18c8._8_8_;
          local_1758 = local_18d8._0_8_;
          uStack_1750 = local_18d8._8_8_;
          local_1748 = local_18e8;
          vpcmpeqd_avx2(ZEXT1632(local_1738),ZEXT1632(local_1738));
          uStack_16f4 = context->user->instID[0];
          local_16f8 = uStack_16f4;
          uStack_16f0 = uStack_16f4;
          uStack_16ec = uStack_16f4;
          uStack_16e8 = context->user->instPrimID[0];
          uStack_16e4 = uStack_16e8;
          uStack_16e0 = uStack_16e8;
          uStack_16dc = uStack_16e8;
          local_1928 = *(int *)(ray + 0x80);
          iStack_1924 = *(int *)(ray + 0x84);
          iStack_1920 = *(int *)(ray + 0x88);
          iStack_191c = *(int *)(ray + 0x8c);
          auVar45 = vmulps_avx512vl(auVar45,local_18a8);
          bVar36 = (bool)(bVar28 >> 1 & 1);
          bVar6 = (bool)(bVar28 >> 2 & 1);
          *(uint *)(ray + 0x80) =
               (uint)(bVar28 & 1) * auVar45._0_4_ | (uint)!(bool)(bVar28 & 1) * local_1928;
          *(uint *)(ray + 0x84) = (uint)bVar36 * auVar45._4_4_ | (uint)!bVar36 * iStack_1924;
          *(uint *)(ray + 0x88) = (uint)bVar6 * auVar45._8_4_ | (uint)!bVar6 * iStack_1920;
          *(uint *)(ray + 0x8c) =
               (uint)(bVar28 >> 3) * auVar45._12_4_ | (uint)!(bool)(bVar28 >> 3) * iStack_191c;
          local_1948 = vpmovm2d_avx512vl((ulong)bVar28);
          args.valid = (int *)local_1948;
          args.geometryUserPtr = pGVar4->userPtr;
          args.context = context->user;
          args.hit = (RTCHitN *)&local_1768;
          args.N = 4;
          args.ray = (RTCRayN *)ray;
          if (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            (*pGVar4->occlusionFilterN)(&args);
            auVar40 = vxorps_avx512vl(auVar40,auVar40);
            auVar89 = ZEXT1664(auVar40);
            auVar40 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
            auVar88 = ZEXT1664(auVar40);
            auVar40 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
            auVar87 = ZEXT1664(auVar40);
            auVar40 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
            auVar86 = ZEXT1664(auVar40);
            auVar40 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
            auVar85 = ZEXT1664(auVar40);
            auVar40 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            auVar84 = ZEXT1664(auVar40);
          }
          auVar40 = auVar89._0_16_;
          uVar37 = vptestmd_avx512vl(local_1948,local_1948);
          uVar37 = uVar37 & 0xf;
          if ((char)uVar37 != '\0') {
            p_Var5 = context->args->filter;
            if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
              (*p_Var5)(&args);
              auVar40 = vxorps_avx512vl(auVar40,auVar40);
              auVar89 = ZEXT1664(auVar40);
              auVar40 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
              auVar88 = ZEXT1664(auVar40);
              auVar40 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
              auVar87 = ZEXT1664(auVar40);
              auVar40 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
              auVar86 = ZEXT1664(auVar40);
              auVar40 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
              auVar85 = ZEXT1664(auVar40);
              auVar40 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
              auVar84 = ZEXT1664(auVar40);
            }
            uVar37 = vptestmd_avx512vl(local_1948,local_1948);
            uVar37 = uVar37 & 0xf;
            auVar40 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
            bVar36 = (bool)((byte)uVar37 & 1);
            auVar57._0_4_ = (uint)bVar36 * auVar40._0_4_ | (uint)!bVar36 * *(int *)(args.ray + 0x80)
            ;
            bVar36 = (bool)((byte)(uVar37 >> 1) & 1);
            auVar57._4_4_ = (uint)bVar36 * auVar40._4_4_ | (uint)!bVar36 * *(int *)(args.ray + 0x84)
            ;
            bVar36 = (bool)((byte)(uVar37 >> 2) & 1);
            auVar57._8_4_ = (uint)bVar36 * auVar40._8_4_ | (uint)!bVar36 * *(int *)(args.ray + 0x88)
            ;
            bVar36 = SUB81(uVar37 >> 3,0);
            auVar57._12_4_ =
                 (uint)bVar36 * auVar40._12_4_ | (uint)!bVar36 * *(int *)(args.ray + 0x8c);
            *(undefined1 (*) [16])(args.ray + 0x80) = auVar57;
          }
          bVar36 = (bool)((byte)uVar37 & 1);
          auVar58._0_4_ = (uint)bVar36 * *(int *)pRVar1 | (uint)!bVar36 * local_1928;
          bVar36 = (bool)((byte)(uVar37 >> 1) & 1);
          auVar58._4_4_ = (uint)bVar36 * *(int *)(ray + 0x84) | (uint)!bVar36 * iStack_1924;
          bVar36 = (bool)((byte)(uVar37 >> 2) & 1);
          auVar58._8_4_ = (uint)bVar36 * *(int *)(ray + 0x88) | (uint)!bVar36 * iStack_1920;
          bVar36 = SUB81(uVar37 >> 3,0);
          auVar58._12_4_ = (uint)bVar36 * *(int *)(ray + 0x8c) | (uint)!bVar36 * iStack_191c;
          *(undefined1 (*) [16])pRVar1 = auVar58;
        }
        bVar29 = ((byte)uVar37 ^ 0xf) & bVar29;
      }
      if ((bVar29 == 0) || (bVar36 = 2 < uVar27, uVar27 = uVar27 + 1, bVar36)) break;
    }
    bVar25 = bVar25 & bVar29;
    if (bVar25 == 0) break;
  }
  bVar25 = bVar25 ^ 0xf;
LAB_00736c90:
  bVar31 = bVar31 | bVar25;
  if (bVar31 == 0xf) {
LAB_00736c99:
    iVar26 = 3;
  }
  else {
    auVar40 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
    tray.tfar.field_0.i[0] =
         (uint)(bVar31 & 1) * auVar40._0_4_ | (uint)!(bool)(bVar31 & 1) * tray.tfar.field_0.i[0];
    bVar36 = (bool)(bVar31 >> 1 & 1);
    tray.tfar.field_0.i[1] = (uint)bVar36 * auVar40._4_4_ | (uint)!bVar36 * tray.tfar.field_0.i[1];
    bVar36 = (bool)(bVar31 >> 2 & 1);
    tray.tfar.field_0.i[2] = (uint)bVar36 * auVar40._8_4_ | (uint)!bVar36 * tray.tfar.field_0.i[2];
    bVar36 = (bool)(bVar31 >> 3 & 1);
    tray.tfar.field_0.i[3] = (uint)bVar36 * auVar40._12_4_ | (uint)!bVar36 * tray.tfar.field_0.i[3];
    iVar26 = 0;
  }
LAB_00736cc1:
  if (iVar26 == 3) {
    bVar31 = bVar31 & bVar38;
    bVar36 = (bool)(bVar31 >> 1 & 1);
    bVar6 = (bool)(bVar31 >> 2 & 1);
    *(uint *)pRVar1 =
         (uint)(bVar31 & 1) * auVar86._0_4_ | (uint)!(bool)(bVar31 & 1) * *(int *)pRVar1;
    *(uint *)(ray + 0x84) = (uint)bVar36 * auVar86._4_4_ | (uint)!bVar36 * *(int *)(ray + 0x84);
    *(uint *)(ray + 0x88) = (uint)bVar6 * auVar86._8_4_ | (uint)!bVar6 * *(int *)(ray + 0x88);
    *(uint *)(ray + 0x8c) =
         (uint)(bVar31 >> 3) * auVar86._12_4_ | (uint)!(bool)(bVar31 >> 3) * *(int *)(ray + 0x8c);
    return;
  }
  goto LAB_00736446;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }